

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O3

bool libwebm::CopyPrimaryChromaticity
               (PrimaryChromaticity *parser_pc,PrimaryChromaticityPtr *muxer_pc)

{
  PrimaryChromaticity *pPVar1;
  PrimaryChromaticity *pPVar2;
  
  pPVar2 = (PrimaryChromaticity *)operator_new(8,(nothrow_t *)&std::nothrow);
  if (pPVar2 != (PrimaryChromaticity *)0x0) {
    *pPVar2 = *parser_pc;
  }
  pPVar1 = (muxer_pc->_M_t).
           super___uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
           ._M_t.
           super__Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
           .super__Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false>._M_head_impl;
  (muxer_pc->_M_t).
  super___uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
  ._M_t.
  super__Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
  .super__Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false>._M_head_impl =
       (PrimaryChromaticity *)pPVar2;
  if (pPVar1 != (PrimaryChromaticity *)0x0) {
    operator_delete(pPVar1);
    pPVar2 = (PrimaryChromaticity *)
             (muxer_pc->_M_t).
             super___uniq_ptr_impl<mkvmuxer::PrimaryChromaticity,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
             ._M_t.
             super__Tuple_impl<0UL,_mkvmuxer::PrimaryChromaticity_*,_std::default_delete<mkvmuxer::PrimaryChromaticity>_>
             .super__Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false>._M_head_impl;
  }
  return pPVar2 != (PrimaryChromaticity *)0x0;
}

Assistant:

bool CopyPrimaryChromaticity(const mkvparser::PrimaryChromaticity& parser_pc,
                             PrimaryChromaticityPtr* muxer_pc) {
  muxer_pc->reset(new (std::nothrow)
                      mkvmuxer::PrimaryChromaticity(parser_pc.x, parser_pc.y));
  if (!muxer_pc->get())
    return false;
  return true;
}